

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall
cs::
allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>,_64UL,_cs_impl::default_allocator_provider>
::free(allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>,_64UL,_cs_impl::default_allocator_provider>
       *this,void *__ptr)

{
  size_t sVar1;
  __int_type _Var2;
  allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>,_64UL,_cs_impl::default_allocator_provider>
  *this_00;
  
  this_00 = this;
  __gnu_cxx::new_allocator<cs_impl::any::holder<std::shared_ptr<cs::context_type>>>::
  destroy<cs_impl::any::holder<std::shared_ptr<cs::context_type>>>
            ((new_allocator<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>_> *)__ptr,
             (holder<std::shared_ptr<cs::context_type>_> *)this);
  if ((this->mOffset < 0x40) &&
     (_Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)this_00), _Var2 == 0)) {
    sVar1 = this->mOffset;
    this->mOffset = sVar1 + 1;
    this->mPool[sVar1] = (holder<std::shared_ptr<cs::context_type>_> *)__ptr;
    return;
  }
  __gnu_cxx::new_allocator<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>_>::deallocate
            ((new_allocator<cs_impl::any::holder<std::shared_ptr<cs::context_type>_>_> *)__ptr,
             (holder<std::shared_ptr<cs::context_type>_> *)this,0x1a9f46);
  return;
}

Assistant:

inline void free(T *ptr)
		{
			mAlloc.destroy(ptr);
			if (mOffset < blck_size && global_thread_counter == 0)
				mPool[mOffset++] = ptr;
			else
				mAlloc.deallocate(ptr, 1);
		}